

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::LogicalExprReader>
::BinaryArgReader(BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::LogicalExprReader>
                  *this,NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                        *r)

{
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
  ReadLogicalExpr_abi_cxx11_
            (&this->lhs,
             (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter> *)
             r);
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
  ReadLogicalExpr_abi_cxx11_
            (&this->rhs,
             (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter> *)
             r);
  return;
}

Assistant:

BinaryArgReader(NLReader &r)
      : lhs(ExprReader().Read(r)), rhs(ExprReader().Read(r)) {}